

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_weapons.cpp
# Opt level: O2

FState * __thiscall AWeapon::GetDownState(AWeapon *this)

{
  VMFunction *func;
  PClass *pPVar1;
  VMFrameStack *this_00;
  FState *retval;
  VMValue params [1];
  VMReturn ret;
  
  if (GetDownState::VIndex == 0xffffffff) {
    GetDownState::VIndex = GetVirtualIndex(RegistrationInfo.MyClass,"GetDownState");
    if (GetDownState::VIndex == 0xffffffff) {
      __assert_fail("VIndex != ~0u",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/g_inventory/a_weapons.cpp"
                    ,0x363,"FState *AWeapon::GetDownState()");
    }
  }
  pPVar1 = DObject::GetClass((DObject *)this);
  if ((GetDownState::VIndex < (pPVar1->Virtuals).Count) &&
     (func = (pPVar1->Virtuals).Array[GetDownState::VIndex], func != (VMFunction *)0x0)) {
    params[0].field_0.field_1.atag = 1;
    params[0].field_0.field_3.Type = '\x03';
    ret.Location = &retval;
    ret.TagOfs = 0;
    ret.RegType = '\x03';
    params[0].field_0._0_8_ = this;
    this_00 = (VMFrameStack *)_ZTW13GlobalVMStack();
    VMFrameStack::Call(this_00,func,params,1,&ret,1,(VMException **)0x0);
    VMValue::~VMValue(params);
  }
  else {
    retval = (FState *)0x0;
  }
  return retval;
}

Assistant:

FState *AWeapon::GetDownState ()
{
	IFVIRTUAL(AWeapon, GetDownState)
	{
		VMValue params[1] = { (DObject*)this };
		VMReturn ret;
		FState *retval;
		ret.PointerAt((void**)&retval);
		GlobalVMStack.Call(func, params, 1, &ret, 1, nullptr);
		return retval;
	}
	return nullptr;
}